

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O1

void __thiscall IsorecursiveTest_Basics_Test::TestBody(IsorecursiveTest_Basics_Test *this)

{
  void *pvVar1;
  Type TVar2;
  Type TVar3;
  char cVar4;
  Nullability NVar5;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  Struct *lhs;
  char *pcVar6;
  char *in_R9;
  pointer *__ptr;
  undefined1 auVar7 [16];
  initializer_list<wasm::Type> types;
  initializer_list<wasm::Field> __l;
  Array AVar8;
  initializer_list<wasm::Field> __l_00;
  Type local_148;
  Type refSig;
  Type newRefSig;
  Type local_130;
  Type refStruct;
  Type refArray;
  Type refNullArray;
  Type refNullAny;
  Type newRefStruct;
  Type newRefArray;
  Type newRefNullArray;
  undefined1 auStack_d8 [8];
  BuildResult result;
  Field local_b0;
  allocator_type local_99;
  undefined1 local_98 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  TypeBuilder builder;
  AssertionResult gtest_ar_1;
  undefined1 auStack_58 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_3;
  
  wasm::TypeBuilder::TypeBuilder
            ((TypeBuilder *)
             &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,3);
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       wasm::TypeBuilder::size();
  newRefNullArray.id = 3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)auStack_d8,"builder.size()","size_t{3}",(unsigned_long *)&builder,
             &newRefNullArray.id);
  if ((internal)auStack_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&builder);
    if (result.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _0_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)result.
                         super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         .
                         super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                         .
                         super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         .
                         super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                         ._M_u._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&newRefNullArray,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0xa4,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&newRefNullArray,(Message *)&builder)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&newRefNullArray);
    if (builder.impl._M_t.
        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
        (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)builder.impl._M_t.
                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl +
                  8))();
    }
    if (result.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&result,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   result.
                   super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .
                   super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                   ._M_u._0_8_);
    }
    goto LAB_00146322;
  }
  if (result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_
      != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&result,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 result.
                 super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                 .
                 super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                 .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                 ._M_u._0_8_);
  }
  NVar5 = wasm::TypeBuilder::getTempHeapType
                    ((ulong)&built.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_148.id = wasm::TypeBuilder::getTempRefType
                           ((HeapType)
                            &built.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,NVar5);
  NVar5 = wasm::TypeBuilder::getTempHeapType
                    ((ulong)&built.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_130.id = wasm::TypeBuilder::getTempRefType
                           ((HeapType)
                            &built.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,NVar5);
  NVar5 = wasm::TypeBuilder::getTempHeapType
                    ((ulong)&built.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  refStruct.id = wasm::TypeBuilder::getTempRefType
                           ((HeapType)
                            &built.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,NVar5);
  NVar5 = wasm::TypeBuilder::getTempHeapType
                    ((ulong)&built.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  refArray.id = wasm::TypeBuilder::getTempRefType
                          ((HeapType)
                           &built.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,NVar5);
  wasm::Type::Type(&refNullArray,(HeapType)0x2,Nullable);
  TVar2.id = local_130.id;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       refStruct.id;
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_7_ = 0;
  types._M_len = 2;
  types._M_array = (iterator)&builder;
  wasm::Tuple::Tuple((Tuple *)auStack_d8,types);
  wasm::TypeBuilder::getTempTupleType
            ((Tuple *)&built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (auStack_d8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_d8,
                    result.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._8_8_ - (long)auStack_d8);
  }
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       refArray.id;
  gtest_ar_1.success_ = false;
  gtest_ar_1._1_7_ = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)&builder;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_d8,__l,
             (allocator_type *)local_98);
  TVar3 = refNullArray;
  newRefNullArray.id = (uintptr_t)auStack_d8;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = TVar2.id;
  wasm::TypeBuilder::setHeapType
            ((ulong)&built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Signature)(auVar7 << 0x40));
  wasm::TypeBuilder::setHeapType
            ((ulong)&built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Struct *)0x1);
  auStack_d8 = (undefined1  [8])TVar3.id;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
       0x100000000;
  AVar8.element._8_8_ = auStack_d8;
  AVar8.element.type.id = 2;
  wasm::TypeBuilder::setHeapType
            ((ulong)&built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,AVar8);
  wasm::TypeBuilder::createRecGroup
            ((ulong)&built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  wasm::TypeBuilder::build();
  local_98[0] = (allocator_type)
                (result.
                 super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                 .
                 super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                 .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                 ._M_u._M_first._M_storage._M_storage[0x10] == '\0');
  built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if ((bool)local_98[0]) {
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)auStack_d8);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_98,__x);
    auStack_58 = (undefined1  [8])
                 ((long)built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                        _M_impl.super__Vector_impl_data._M_start -
                  CONCAT71(local_98._1_7_,local_98[0]) >> 3);
    local_38 = (undefined1  [8])0x3;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&builder,"built.size()","size_t{3}",(unsigned_long *)auStack_58,
               (unsigned_long *)local_38);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)auStack_58);
      if (gtest_ar_1._0_8_ == 0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar_1._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0xb9,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_38,(Message *)auStack_58);
LAB_00145e7f:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_38);
      if (auStack_58 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auStack_58 + 8))();
      }
LAB_001462c4:
      if (gtest_ar_1._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar_1._0_8_);
      }
    }
    else {
      if (gtest_ar_1._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar_1._0_8_);
      }
      cVar4 = wasm::HeapType::isSignature();
      auStack_58[0] = cVar4;
      gtest_ar__1.success_ = false;
      gtest_ar__1._1_7_ = 0;
      if (cVar4 == '\0') {
        testing::Message::Message((Message *)local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&builder,(internal *)auStack_58,
                   (AssertionResult *)"built[0].isSignature()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                   ,0xbc,(char *)builder.impl._M_t.
                                 super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                 _M_head_impl);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
        if (builder.impl._M_t.
            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
            (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
            &gtest_ar_1.message_) {
          operator_delete((void *)builder.impl._M_t.
                                  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                  .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                  _M_head_impl,
                          (long)gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 1);
        }
        if (local_38 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_38 + 8))();
        }
        if (gtest_ar__1._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar__1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar__1._0_8_);
        }
      }
      else {
        gtest_ar__1.success_ = false;
        gtest_ar__1._1_7_ = 0;
        cVar4 = wasm::HeapType::isStruct();
        auStack_58[0] = cVar4;
        gtest_ar__1.success_ = false;
        gtest_ar__1._1_7_ = 0;
        if (cVar4 == '\0') {
          testing::Message::Message((Message *)local_38);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&builder,(internal *)auStack_58,
                     (AssertionResult *)"built[1].isStruct()","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                     ,0xbd,(char *)builder.impl._M_t.
                                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                   _M_head_impl);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_38);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
          if (builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
              (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
              &gtest_ar_1.message_) {
            operator_delete((void *)builder.impl._M_t.
                                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                    _M_head_impl,
                            (long)gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 1);
          }
          if (local_38 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_38 + 8))();
          }
          if (gtest_ar__1._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar__1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar__1._0_8_);
          }
        }
        else {
          gtest_ar__1.success_ = false;
          gtest_ar__1._1_7_ = 0;
          cVar4 = wasm::HeapType::isArray();
          auStack_58[0] = cVar4;
          gtest_ar__1.success_ = false;
          gtest_ar__1._1_7_ = 0;
          if (cVar4 != '\0') {
            gtest_ar__1.success_ = false;
            gtest_ar__1._1_7_ = 0;
            wasm::Type::Type(&refSig,(HeapType)*(uintptr_t *)CONCAT71(local_98._1_7_,local_98[0]),
                             NonNullable);
            wasm::Type::Type(&refNullAny,
                             (HeapType)*(uintptr_t *)(CONCAT71(local_98._1_7_,local_98[0]) + 8),
                             NonNullable);
            wasm::Type::Type(&newRefStruct,
                             (HeapType)*(uintptr_t *)(CONCAT71(local_98._1_7_,local_98[0]) + 0x10),
                             NonNullable);
            wasm::Type::Type(&newRefArray,
                             (HeapType)*(uintptr_t *)(CONCAT71(local_98._1_7_,local_98[0]) + 0x10),
                             Nullable);
            auVar7 = wasm::HeapType::getSignature();
            gtest_ar__1._0_8_ = auVar7._8_8_;
            auStack_58 = auVar7._0_8_;
            local_b0.type.id = newRefStruct.id;
            local_b0.packedType = i16;
            local_b0.mutable_ = Immutable;
            wasm::Type::Type(&newRefSig,&local_b0,2);
            local_38 = (undefined1  [8])refNullAny.id;
            gtest_ar_3._0_8_ = newRefSig.id;
            testing::internal::CmpHelperEQ<wasm::Signature,wasm::Signature>
                      ((internal *)&builder,"built[0].getSignature()",
                       "Signature(newRefStruct, {newRefArray, Type::i32})",(Signature *)auStack_58,
                       (Signature *)local_38);
            if ((char)builder.impl._M_t.
                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0')
            {
              testing::Message::Message((Message *)auStack_58);
              if (gtest_ar_1._0_8_ == 0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)gtest_ar_1._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_38,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                         ,199,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_38,(Message *)auStack_58);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_38);
              if (auStack_58 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)auStack_58 + 8))();
              }
            }
            if (gtest_ar_1._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar_1._0_8_);
            }
            lhs = (Struct *)wasm::HeapType::getStruct();
            local_b0.type.id = newRefArray.id;
            local_b0.packedType = not_packed;
            local_b0.mutable_ = Immutable;
            __l_00._M_len = 1;
            __l_00._M_array = &local_b0;
            std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_58,__l_00,
                       &local_99);
            builder.impl._M_t.
            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
                 (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                 )(unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   )auStack_58;
            gtest_ar_1.success_ = gtest_ar__1.success_;
            gtest_ar_1._1_7_ = gtest_ar__1._1_7_;
            gtest_ar_1.message_ = gtest_ar__1.message_;
            auStack_58 = (undefined1  [8])0x0;
            gtest_ar__1.success_ = false;
            gtest_ar__1._1_7_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            testing::internal::CmpHelperEQ<wasm::Struct,wasm::Struct>
                      ((internal *)local_38,"built[1].getStruct()",
                       "Struct({Field(newRefNullArray, Immutable)})",lhs,(Struct *)&builder);
            if (builder.impl._M_t.
                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
                (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
                 )0x0) {
              operator_delete((void *)builder.impl._M_t.
                                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                      _M_head_impl,
                              (long)gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl -
                              (long)builder.impl._M_t.
                                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                    _M_head_impl);
            }
            if (auStack_58 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_58,
                              (long)gtest_ar__1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl - (long)auStack_58);
            }
            if (local_38[0] == (internal)0x0) {
              testing::Message::Message((Message *)&builder);
              if (gtest_ar_3._0_8_ == 0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)gtest_ar_3._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)auStack_58,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                         ,200,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)auStack_58,(Message *)&builder);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_58);
              if (builder.impl._M_t.
                  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                  .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
                  (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
                   )0x0) {
                (**(code **)(*(long *)builder.impl._M_t.
                                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                      _M_head_impl + 8))();
              }
            }
            if (gtest_ar_3._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar_3,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar_3._0_8_);
            }
            wasm::HeapType::getArray();
            local_38 = (undefined1  [8])refNullArray.id;
            gtest_ar_3.success_ = false;
            gtest_ar_3._1_7_ = 0x1000000;
            testing::internal::CmpHelperEQ<wasm::Array,wasm::Array>
                      ((internal *)&builder,"built[2].getArray()",
                       "Array(Field(refNullAny, Mutable))",(Array *)auStack_58,(Array *)local_38);
            if ((char)builder.impl._M_t.
                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0')
            {
              testing::Message::Message((Message *)auStack_58);
              if (gtest_ar_1._0_8_ == 0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)gtest_ar_1._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_38,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                         ,0xc9,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_38,(Message *)auStack_58);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_38);
              if (auStack_58 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)auStack_58 + 8))();
              }
            }
            if (gtest_ar_1._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar_1._0_8_);
            }
            testing::internal::CmpHelperNE<wasm::Type,wasm::Type>
                      ((internal *)&builder,"newRefSig","refSig",&refSig,&local_148);
            if ((char)builder.impl._M_t.
                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0')
            {
              testing::Message::Message((Message *)auStack_58);
              if (gtest_ar_1._0_8_ == 0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)gtest_ar_1._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_38,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                         ,0xcc,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_38,(Message *)auStack_58);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_38);
              if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   )auStack_58 !=
                  (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                (**(code **)(*(long *)auStack_58 + 8))();
              }
            }
            if (gtest_ar_1._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar_1._0_8_);
            }
            testing::internal::CmpHelperNE<wasm::Type,wasm::Type>
                      ((internal *)&builder,"newRefStruct","refStruct",&refNullAny,&local_130);
            if ((char)builder.impl._M_t.
                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0')
            {
              testing::Message::Message((Message *)auStack_58);
              if (gtest_ar_1._0_8_ == 0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)gtest_ar_1._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_38,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                         ,0xcd,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_38,(Message *)auStack_58);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_38);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )auStack_58 !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)auStack_58 + 8))();
              }
            }
            if (gtest_ar_1._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar_1._0_8_);
            }
            testing::internal::CmpHelperNE<wasm::Type,wasm::Type>
                      ((internal *)&builder,"newRefArray","refArray",&newRefStruct,&refStruct);
            if ((char)builder.impl._M_t.
                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0')
            {
              testing::Message::Message((Message *)auStack_58);
              if (gtest_ar_1._0_8_ == 0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)gtest_ar_1._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_38,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                         ,0xce,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_38,(Message *)auStack_58);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_38);
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )auStack_58 !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)auStack_58 + 8))();
              }
            }
            if (gtest_ar_1._0_8_ != 0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&gtest_ar_1,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           gtest_ar_1._0_8_);
            }
            testing::internal::CmpHelperNE<wasm::Type,wasm::Type>
                      ((internal *)&builder,"newRefNullArray","refNullArray",&newRefArray,&refArray)
            ;
            if ((char)builder.impl._M_t.
                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0')
            {
              testing::Message::Message((Message *)auStack_58);
              if (gtest_ar_1._0_8_ == 0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)gtest_ar_1._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_38,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                         ,0xcf,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_38,(Message *)auStack_58);
              goto LAB_00145e7f;
            }
            goto LAB_001462c4;
          }
          testing::Message::Message((Message *)local_38);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&builder,(internal *)auStack_58,
                     (AssertionResult *)"built[2].isArray()","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                     ,0xbe,(char *)builder.impl._M_t.
                                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                   _M_head_impl);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_38);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
          if (builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
              (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
              &gtest_ar_1.message_) {
            operator_delete((void *)builder.impl._M_t.
                                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                    _M_head_impl,
                            (long)gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 1);
          }
          if (local_38 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_38 + 8))();
          }
          if (gtest_ar__1._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar__1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar__1._0_8_);
          }
        }
      }
    }
    pvVar1 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)built.
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1);
    }
  }
  else {
    testing::Message::Message((Message *)auStack_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&builder,(internal *)local_98,(AssertionResult *)"result","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0xb7,(char *)builder.impl._M_t.
                             super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_38,(Message *)auStack_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_38);
    if (builder.impl._M_t.
        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
        (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
        &gtest_ar_1.message_) {
      operator_delete((void *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                      (long)gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if (auStack_58 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)auStack_58 + 8))();
    }
    if (built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&built,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                   .super__Vector_impl_data._M_start);
    }
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr
    [result.
     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
     .
     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
     .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
     _M_first._M_storage._M_storage[0x10]]._M_data)
            ((anon_class_1_0_00000001 *)&builder,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)auStack_d8);
  if (newRefNullArray.id != 0) {
    operator_delete((void *)newRefNullArray.id,
                    result.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._8_8_ - newRefNullArray.id);
  }
LAB_00146322:
  wasm::TypeBuilder::~TypeBuilder
            ((TypeBuilder *)
             &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, Basics) {
  // (type $sig (func (param (ref $struct)) (result (ref $array) i32)))
  // (type $struct (struct (field (ref null $array))))
  // (type $array (array (mut anyref)))
  TypeBuilder builder(3);
  ASSERT_EQ(builder.size(), size_t{3});

  Type refSig = builder.getTempRefType(builder[0], NonNullable);
  Type refStruct = builder.getTempRefType(builder[1], NonNullable);
  Type refArray = builder.getTempRefType(builder[2], NonNullable);
  Type refNullArray = builder.getTempRefType(builder[2], Nullable);
  Type refNullAny(HeapType::any, Nullable);

  Signature sig(refStruct, builder.getTempTupleType({refArray, Type::i32}));
  Struct struct_({Field(refNullArray, Immutable)});
  Array array(Field(refNullAny, Mutable));

  builder[0] = sig;
  builder[1] = struct_;
  builder[2] = array;

  builder.createRecGroup(0, 3);

  auto result = builder.build();
  ASSERT_TRUE(result);
  std::vector<HeapType> built = *result;
  ASSERT_EQ(built.size(), size_t{3});

  // The built types should have the correct kinds.
  ASSERT_TRUE(built[0].isSignature());
  ASSERT_TRUE(built[1].isStruct());
  ASSERT_TRUE(built[2].isArray());

  // The built types should have the correct structure.
  Type newRefSig = Type(built[0], NonNullable);
  Type newRefStruct = Type(built[1], NonNullable);
  Type newRefArray = Type(built[2], NonNullable);
  Type newRefNullArray = Type(built[2], Nullable);

  EXPECT_EQ(built[0].getSignature(),
            Signature(newRefStruct, {newRefArray, Type::i32}));
  EXPECT_EQ(built[1].getStruct(), Struct({Field(newRefNullArray, Immutable)}));
  EXPECT_EQ(built[2].getArray(), Array(Field(refNullAny, Mutable)));

  // The built types should be different from the temporary types.
  EXPECT_NE(newRefSig, refSig);
  EXPECT_NE(newRefStruct, refStruct);
  EXPECT_NE(newRefArray, refArray);
  EXPECT_NE(newRefNullArray, refNullArray);
}